

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperloglog.cpp
# Opt level: O1

unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> __thiscall
duckdb::HyperLogLog::Copy(HyperLogLog *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  pointer pHVar9;
  pointer *__ptr;
  undefined8 *in_RSI;
  
  puVar8 = (undefined8 *)operator_new(0x40);
  *puVar8 = 0;
  puVar8[1] = 0;
  puVar8[2] = 0;
  puVar8[3] = 0;
  puVar8[4] = 0;
  puVar8[5] = 0;
  puVar8[6] = 0;
  puVar8[7] = 0;
  *(undefined8 **)this->k = puVar8;
  pHVar9 = unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>::
           operator->((unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>
                       *)this);
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  uVar5 = in_RSI[4];
  uVar6 = in_RSI[5];
  uVar7 = in_RSI[7];
  *(undefined8 *)(pHVar9->k + 0x30) = in_RSI[6];
  *(undefined8 *)(pHVar9->k + 0x38) = uVar7;
  *(undefined8 *)(pHVar9->k + 0x20) = uVar5;
  *(undefined8 *)(pHVar9->k + 0x28) = uVar6;
  *(undefined8 *)(pHVar9->k + 0x10) = uVar3;
  *(undefined8 *)(pHVar9->k + 0x18) = uVar4;
  *(undefined8 *)pHVar9->k = uVar1;
  *(undefined8 *)(pHVar9->k + 8) = uVar2;
  return (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)
         (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>)this;
}

Assistant:

unique_ptr<HyperLogLog> HyperLogLog::Copy() const {
	auto result = make_uniq<HyperLogLog>();
	memcpy(result->k, this->k, sizeof(k));
	D_ASSERT(result->Count() == Count());
	return result;
}